

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

void __thiscall libtorrent::session::~session(session *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  if ((this->m_impl).super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    aux::dump_call_profile();
    aux::session_impl::call_abort
              ((this->m_impl).
               super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    if ((((this->m_thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) &&
        (p_Var1 = (this->m_thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi, p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
       && (p_Var1->_M_use_count == 1)) {
      ::std::thread::join();
    }
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_impl).
              super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_io_service).
              super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_session_handle).m_impl.
              super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

session::~session()
	{
		if (!m_impl) return;

		aux::dump_call_profile();

		// capture the shared_ptr in the dispatched function
		// to keep the session_impl alive
		m_impl->call_abort();

		if (m_thread && m_thread.use_count() == 1)
		{
#if defined TORRENT_ASIO_DEBUGGING
			wait_for_asio_handlers();
#endif
			m_thread->join();
		}
	}